

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media_test.cpp
# Opt level: O0

void __thiscall HenyeyGreenstein_Normalized_Test::TestBody(HenyeyGreenstein_Normalized_Test *this)

{
  bool bVar1;
  undefined4 uVar2;
  float line;
  Float FVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  float fVar8;
  Vector3f VVar9;
  AssertionResult gtest_ar;
  Vector3f wi;
  Point2f u;
  Stratified2DIter __end2;
  Stratified2DIter __begin2;
  Stratified2D *__range2;
  int nSamples;
  int sqrtSamples;
  Float sum;
  Vector3f wo;
  HGPhaseFunction hg;
  float g;
  RNG rng;
  Stratified2DIter *in_stack_fffffffffffffeb8;
  RNG *in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  Stratified2D *this_00;
  undefined4 in_stack_fffffffffffffed8;
  Point2f *u_00;
  Type in_stack_fffffffffffffeec;
  AssertHelper *in_stack_fffffffffffffef0;
  RNG local_f8;
  undefined8 local_e8;
  float local_e0;
  undefined8 local_d4;
  float local_cc;
  Message *in_stack_ffffffffffffff38;
  AssertHelper *in_stack_ffffffffffffff40;
  IndexingIterator<pbrt::detail::Stratified2DIter> local_a0 [4];
  undefined1 local_80 [32];
  undefined1 *abs_error;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 uVar10;
  float fVar11;
  char *abs_error_expr;
  undefined4 in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  HGPhaseFunction local_20;
  float local_1c;
  undefined1 auVar7 [56];
  undefined1 extraout_var [56];
  
  pbrt::RNG::RNG((RNG *)&stack0xffffffffffffffe8);
  for (local_1c = -0.75; local_1c <= 0.75; local_1c = local_1c + 0.25) {
    pbrt::HGPhaseFunction::HGPhaseFunction(&local_20,local_1c);
    this_00 = (Stratified2D *)&stack0xffffffffffffffe8;
    line = pbrt::RNG::Uniform<float>(in_stack_fffffffffffffec0);
    pbrt::RNG::Uniform<float>(in_stack_fffffffffffffec0);
    auVar7 = (undefined1  [56])0x0;
    u_00 = (Point2f *)&stack0xffffffffffffffcc;
    pbrt::Point2<float>::Point2
              ((Point2<float> *)in_stack_fffffffffffffec0,
               (float)((ulong)in_stack_fffffffffffffeb8 >> 0x20),SUB84(in_stack_fffffffffffffeb8,0))
    ;
    VVar9 = pbrt::SampleUniformSphere(u_00);
    fVar8 = VVar9.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar4._0_8_ = VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar4._8_56_ = auVar7;
    abs_error_expr = (char *)vmovlpd_avx(auVar4._0_16_);
    fVar11 = 0.0;
    uVar10 = 0x40;
    uVar2 = 0x1000;
    pbrt::Stratified2D::Stratified2D
              (this_00,in_stack_fffffffffffffecc,in_stack_fffffffffffffec8,
               (uint64_t)in_stack_fffffffffffffec0,(uint64_t)in_stack_fffffffffffffeb8);
    abs_error = local_80;
    pbrt::detail::IndexingGenerator<pbrt::Stratified2D,_pbrt::detail::Stratified2DIter>::begin
              ((IndexingGenerator<pbrt::Stratified2D,_pbrt::detail::Stratified2DIter> *)
               in_stack_fffffffffffffec0);
    pbrt::detail::IndexingGenerator<pbrt::Stratified2D,_pbrt::detail::Stratified2DIter>::end
              ((IndexingGenerator<pbrt::Stratified2D,_pbrt::detail::Stratified2DIter> *)
               in_stack_fffffffffffffec0);
    while (bVar1 = pbrt::detail::IndexingIterator<pbrt::detail::Stratified2DIter>::operator!=
                             ((IndexingIterator<pbrt::detail::Stratified2DIter> *)
                              in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8), bVar1) {
      auVar5._0_8_ = pbrt::detail::Stratified2DIter::operator*
                               ((Stratified2DIter *)CONCAT44(line,in_stack_fffffffffffffed8));
      auVar5._8_56_ = extraout_var;
      in_stack_ffffffffffffff38 = (Message *)vmovlpd_avx(auVar5._0_16_);
      auVar7 = extraout_var;
      VVar9 = pbrt::SampleUniformSphere(u_00);
      local_e0 = VVar9.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar6._0_8_ = VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar6._8_56_ = auVar7;
      local_e8 = vmovlpd_avx(auVar6._0_16_);
      local_d4 = local_e8;
      local_cc = local_e0;
      FVar3 = pbrt::HGPhaseFunction::p
                        ((HGPhaseFunction *)this_00,
                         (Vector3f *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                         (Vector3f *)in_stack_fffffffffffffec0);
      fVar11 = FVar3 + fVar11;
      pbrt::detail::IndexingIterator<pbrt::detail::Stratified2DIter>::operator++(local_a0);
    }
    in_stack_fffffffffffffec0 = &local_f8;
    testing::internal::DoubleNearPredFormat
              (in_stack_ffffffffffffffc8,(char *)CONCAT44(in_stack_ffffffffffffffc4,fVar8),
               abs_error_expr,(double)CONCAT44(fVar11,uVar10),
               (double)CONCAT44(uVar2,in_stack_ffffffffffffffa8),(double)abs_error);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)in_stack_fffffffffffffec0);
    in_stack_fffffffffffffecc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffecc);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffef0);
      in_stack_fffffffffffffeb8 =
           (Stratified2DIter *)
           testing::AssertionResult::failure_message((AssertionResult *)0x54c4ab);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,(char *)u_00,(int)line,
                 (char *)this_00);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffec0);
      testing::Message::~Message((Message *)0x54c4f7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x54c537);
  }
  return;
}

Assistant:

TEST(HenyeyGreenstein, Normalized) {
    RNG rng;
    for (float g = -.75; g <= 0.75; g += 0.25) {
        HGPhaseFunction hg(g);
        Vector3f wo = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
        Float sum = 0;
        int sqrtSamples = 64;
        int nSamples = sqrtSamples * sqrtSamples;
        for (Point2f u : Stratified2D(sqrtSamples, sqrtSamples)) {
            Vector3f wi = SampleUniformSphere(u);
            sum += hg.p(wo, wi);
        }
        // Phase function should integrate to 1/4pi.
        EXPECT_NEAR(sum / nSamples, 1. / (4. * Pi), 1e-3f);
    }
}